

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O1

int If_CutDelaySop(If_Man_t *p,If_Cut_t *pCut)

{
  If_Cut_t *pIVar1;
  long lVar2;
  uint uVar3;
  float fVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char cVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar3 = *(uint *)&pCut->field_0x1c;
  iVar8 = 0;
  *(uint *)&pCut->field_0x1c = uVar3 | 0x2000;
  if (0xffffff < uVar3) {
    pIVar1 = pCut + 1;
    uVar13 = uVar3 >> 0x18;
    if (uVar13 == 1) {
      fVar4 = pIVar1->Area;
      if (((long)(int)fVar4 < 0) || (p->vObjs->nSize <= (int)fVar4)) {
LAB_0041bd45:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar8 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar4] + 0x5c);
    }
    else {
      if (pCut->iCutFunc < 0) {
        __assert_fail("pCut->iCutFunc >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
      }
      uVar9 = (uint)pCut->iCutFunc >> 1;
      if (p->vTtIsops[uVar13]->nSize <= (int)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = p->vTtIsops[uVar13]->pArray;
      uVar5 = pVVar6[uVar9].nSize;
      iVar8 = -1;
      if (((ulong)uVar5 != 0) && ((int)uVar5 <= p->pPars->nGateSize)) {
        if (0x10ffffff < uVar3) {
          __assert_fail("If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x56,"int If_CutDelaySop(If_Man_t *, If_Cut_t *)");
        }
        uVar12 = 0;
        if (0 < (int)uVar5) {
          uVar16 = 0;
          do {
            iVar8 = 0;
            uVar15 = 0;
            do {
              uVar14 = (int)uVar15 +
                       (uint)((pVVar6[uVar9].pArray[uVar16] >> ((byte)iVar8 & 0x1f) & 3U) - 1 < 2);
              uVar15 = (ulong)uVar14;
              iVar8 = iVar8 + 2;
            } while (uVar13 * 2 != iVar8);
            if ((int)uVar12 <= (int)uVar14) {
              uVar12 = uVar15;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar5);
        }
        lVar2 = (ulong)uVar13 * 4;
        uVar13 = uVar3 >> 0x18;
        if ((int)uVar5 < 2) {
          *(uint *)&pCut->field_0x1c = uVar3 & 0x1ffff000 | 0x2000 | uVar5 & 0xfff;
          cVar11 = (char)(int)(If_CutDelaySop::GateDelays[uVar3 >> 0x18] + 0.5);
          uVar12 = 0;
          iVar8 = 0;
          do {
            fVar4 = (&pIVar1->Area)[uVar12];
            if (((long)(int)fVar4 < 0) || (p->vObjs->nSize <= (int)fVar4)) goto LAB_0041bd45;
            pvVar7 = p->vObjs->pArray[(int)fVar4];
            if (pvVar7 == (void *)0x0) {
              return iVar8;
            }
            fVar4 = *(float *)((long)pvVar7 + 0x5c);
            *(char *)((long)&pCut[1].Area + uVar12 + lVar2) = cVar11;
            iVar10 = (int)(fVar4 + (float)(int)cVar11);
            if (iVar8 <= iVar10) {
              iVar8 = iVar10;
            }
            uVar12 = uVar12 + 1;
          } while (uVar13 + (uVar13 == 0) != uVar12);
        }
        else {
          *(uint *)&pCut->field_0x1c = uVar3 & 0x1ffff000 | 0x2000 | uVar5 + 1 & 0xfff;
          cVar11 = (char)(int)(If_CutDelaySop::GateDelays[uVar3 >> 0x18] +
                               If_CutDelaySop::GateDelays[uVar12] + 0.5);
          uVar12 = 0;
          iVar8 = 0;
          do {
            fVar4 = (&pIVar1->Area)[uVar12];
            if (((long)(int)fVar4 < 0) || (p->vObjs->nSize <= (int)fVar4)) goto LAB_0041bd45;
            pvVar7 = p->vObjs->pArray[(int)fVar4];
            if (pvVar7 == (void *)0x0) {
              return iVar8;
            }
            fVar4 = *(float *)((long)pvVar7 + 0x5c);
            *(char *)((long)&pCut[1].Area + uVar12 + lVar2) = cVar11;
            iVar10 = (int)(fVar4 + (float)(int)cVar11);
            if (iVar8 <= iVar10) {
              iVar8 = iVar10;
            }
            uVar12 = uVar12 + 1;
          } while (uVar13 + (uVar13 == 0) != uVar12);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int If_CutDelaySop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    // delay is calculated using 1+log2(NumFanins)
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Int_t * vCover;
    If_Obj_t * pLeaf;
    int i, nLitMax, Delay, DelayMax;
    // mark cut as a user cut
    pCut->fUser = 1;
    if ( pCut->nLeaves == 0 )
        return 0;
    if ( pCut->nLeaves == 1 )
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
    if ( Vec_IntSize(vCover) == 0 )
        return -1;
    // mark the output as complemented
//    vAnds = If_CutDelaySopAnds( p, pCut, vCover, RetValue ^ pCut->fCompl );
    if ( Vec_IntSize(vCover) > p->pPars->nGateSize )
        return -1;
    // set the area cost
    assert( If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16 );
    // compute the gate delay
    nLitMax = If_CutMaxCubeSize( vCover, If_CutLeaveNum(pCut) );
    if ( Vec_IntSize(vCover) < 2 )
    {
        pCut->Cost = Vec_IntSize(vCover);
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    else
    {
        pCut->Cost = Vec_IntSize(vCover) + 1;
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + GateDelays[nLitMax] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    return DelayMax;
}